

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O1

void SequenceSpanTask::takedown(search *sch,multi_ex *ec)

{
  return;
}

Assistant:

void takedown(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();

  if (D.encoding == BILOU)
    for (size_t n = 0; n < ec.size(); n++)
    {
      MULTICLASS::label_t ylab = ec[n]->l.multi;
      ylab.label = bilou_to_bio(ylab.label);
    }
}